

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbcursor.cpp
# Opt level: O0

xcb_cursor_t __thiscall QXcbCursor::createNonStandardCursor(QXcbCursor *this,int cshape)

{
  xcb_window_t xVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  xcb_pixmap_t xVar5;
  xcb_pixmap_t xVar6;
  xcb_connection_t *pxVar7;
  ulong uVar8;
  int iVar9;
  int in_ESI;
  long in_FS_OFFSET;
  bool bVar10;
  xcb_pixmap_t pmm_4;
  xcb_pixmap_t pm_4;
  xcb_pixmap_t pmm_3;
  xcb_pixmap_t pm_3;
  bool open;
  xcb_pixmap_t pmm_2;
  xcb_pixmap_t pm_2;
  int i_2;
  int hs;
  xcb_pixmap_t pmm_1;
  xcb_pixmap_t pm_1;
  int i_1;
  xcb_pixmap_t pmm;
  xcb_pixmap_t pm;
  int i;
  xcb_pixmap_t mp;
  xcb_pixmap_t cp;
  xcb_connection_t *conn;
  xcb_cursor_t cursor;
  QImage image;
  ImageConversionFlag in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar11;
  uint8_t *local_158;
  uint8_t *local_140;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QXcbScreen *in_stack_fffffffffffffed8;
  xcb_connection_t *pxVar12;
  xcb_cursor_t local_68;
  QImage local_50 [24];
  QPixmap local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0;
  pxVar7 = QXcbObject::xcb_connection((QXcbObject *)0x19a56f);
  if (in_ESI == 10) {
    xVar1 = QXcbScreen::root((QXcbScreen *)0x19a5a6);
    uVar2 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,cur_blank_bits,0x10,0x10,1,0,0,0);
    xVar1 = QXcbScreen::root((QXcbScreen *)0x19a611);
    uVar11 = 0;
    uVar3 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,cur_blank_bits,0x10,0x10,1,0,0,0);
    local_68 = xcb_generate_id(pxVar7);
    xcb_create_cursor(pxVar7,local_68,uVar2,uVar3,0,0,0,0xffff,CONCAT44(uVar11,0xffff),0xffff,8,8);
  }
  else if ((in_ESI < 5) || (8 < in_ESI)) {
    if (((in_ESI < 0xb) || (0xc < in_ESI)) && ((in_ESI != 0xf && (in_ESI != 0x10)))) {
      if (in_ESI == 0xe) {
        pxVar12 = pxVar7;
        xVar1 = QXcbScreen::root((QXcbScreen *)0x19aab5);
        uVar2 = xcb_create_pixmap_from_bitmap_data(pxVar12,xVar1,"",0x14,0x14,1,0,0,0);
        xVar1 = QXcbScreen::root((QXcbScreen *)0x19ab2c);
        uVar11 = 0;
        uVar3 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,forbiddenm_bits,0x14,0x14,1,0,0,0);
        local_68 = xcb_generate_id(pxVar7);
        xcb_create_cursor(pxVar7,local_68,uVar2,uVar3,0,0,0,0xffff,CONCAT44(uVar11,0xffff),0xffff,10
                          ,10);
      }
      else if ((in_ESI == 0x11) || (in_ESI == 0x12)) {
        xVar1 = QXcbScreen::root((QXcbScreen *)0x19ac47);
        if (in_ESI != 0x11) {
          local_140 = "";
        }
        else {
          local_140 = openhand_bits;
        }
        uVar2 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,local_140,0x10,0x10,1,0,0,0);
        xVar1 = QXcbScreen::root((QXcbScreen *)0x19acd6);
        if (in_ESI != 0x11) {
          local_158 = "";
        }
        else {
          local_158 = openhandm_bits;
        }
        uVar11 = 0;
        uVar3 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,local_158,0x10,0x10,1,0,0,0);
        local_68 = xcb_generate_id(pxVar7);
        xcb_create_cursor(pxVar7,local_68,uVar2,uVar3,0,0,0,0xffff,CONCAT44(uVar11,0xffff),0xffff,8,
                          8);
      }
      else if (((in_ESI == 0x13) || (in_ESI == 0x14)) || (in_ESI == 0x15)) {
        local_20 = 0xaaaaaaaaaaaaaaaa;
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        QGuiApplicationPrivate::instance();
        QGuiApplicationPrivate::getPixmapCursor((CursorShape)local_38);
        QPixmap::toImage();
        QPixmap::~QPixmap(local_38);
        uVar8 = QImage::isNull();
        if ((uVar8 & 1) == 0) {
          xVar5 = qt_xcb_XPixmapFromBitmap
                            (in_stack_fffffffffffffed8,
                             (QImage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                            );
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
          QImage::createAlphaMask((QFlags_conflict *)local_50);
          xVar6 = qt_xcb_XPixmapFromBitmap
                            (in_stack_fffffffffffffed8,
                             (QImage *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                            );
          QImage::~QImage(local_50);
          local_68 = xcb_generate_id(pxVar7);
          xcb_create_cursor(pxVar7,local_68,xVar5,xVar6,0,0,0,0xffff,CONCAT44(uVar2,0xffff),0xffff,8
                            ,8);
          xcb_free_pixmap(pxVar7,xVar5);
          xcb_free_pixmap(pxVar7,xVar6);
        }
        QImage::~QImage((QImage *)&local_20);
      }
    }
    else {
      iVar9 = (in_ESI + -0xb) * 2;
      xVar1 = QXcbScreen::root((QXcbScreen *)0x19a8c7);
      uVar2 = xcb_create_pixmap_from_bitmap_data
                        (pxVar7,xVar1,cursor_bits32[iVar9],0x20,0x20,1,0,0,0);
      xVar1 = QXcbScreen::root((QXcbScreen *)0x19a93e);
      uVar11 = 0;
      uVar3 = xcb_create_pixmap_from_bitmap_data
                        (pxVar7,xVar1,cursor_bits32[iVar9 + 1],0x20,0x20,1,0,0,0);
      bVar10 = true;
      if ((in_ESI != 0xd) && (bVar10 = true, in_ESI != 0xf)) {
        bVar10 = in_ESI == 0x10;
      }
      uVar4 = 0x10;
      if (bVar10) {
        uVar4 = 0;
      }
      local_68 = xcb_generate_id(pxVar7);
      xcb_create_cursor(pxVar7,local_68,uVar2,uVar3,0,0,0,0xffff,CONCAT44(uVar11,0xffff),0xffff,
                        uVar4,uVar4);
    }
  }
  else {
    iVar9 = (in_ESI + -5) * 2;
    xVar1 = QXcbScreen::root((QXcbScreen *)0x19a720);
    uVar2 = xcb_create_pixmap_from_bitmap_data(pxVar7,xVar1,cursor_bits16[iVar9],0x10,0x10,1,0,0,0);
    xVar1 = QXcbScreen::root((QXcbScreen *)0x19a797);
    uVar11 = 0;
    uVar3 = xcb_create_pixmap_from_bitmap_data
                      (pxVar7,xVar1,cursor_bits16[iVar9 + 1],0x10,0x10,1,0,0,0);
    local_68 = xcb_generate_id(pxVar7);
    xcb_create_cursor(pxVar7,local_68,uVar2,uVar3,0,0,0,0xffff,CONCAT44(uVar11,0xffff),0xffff,8,8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

xcb_cursor_t QXcbCursor::createNonStandardCursor(int cshape)
{
    xcb_cursor_t cursor = 0;
    xcb_connection_t *conn = xcb_connection();

    if (cshape == Qt::BlankCursor) {
        xcb_pixmap_t cp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        xcb_pixmap_t mp = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(), cur_blank_bits, 16, 16,
                                                             1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, cp, mp, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape >= Qt::SizeVerCursor && cshape < Qt::SizeAllCursor) {
        int i = (cshape - Qt::SizeVerCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits16[i]),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits16[i + 1]),
                                                              16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if ((cshape >= Qt::SplitVCursor && cshape <= Qt::SplitHCursor)
               || cshape == Qt::WhatsThisCursor || cshape == Qt::BusyCursor) {
        int i = (cshape - Qt::SplitVCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits32[i]),
                                                             32, 32, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits32[i + 1]),
                                                              32, 32, 1, 0, 0, nullptr);
        int hs = (cshape == Qt::PointingHandCursor || cshape == Qt::WhatsThisCursor
                  || cshape == Qt::BusyCursor) ? 0 : 16;
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, hs, hs);
    } else if (cshape == Qt::ForbiddenCursor) {
        int i = (cshape - Qt::ForbiddenCursor) * 2;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(cursor_bits20[i]),
                                                             20, 20, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                              const_cast<uint8_t*>(cursor_bits20[i + 1]),
                                                              20, 20, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 10, 10);
    } else if (cshape == Qt::OpenHandCursor || cshape == Qt::ClosedHandCursor) {
        bool open = cshape == Qt::OpenHandCursor;
        xcb_pixmap_t pm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhand_bits : closedhand_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        xcb_pixmap_t pmm = xcb_create_pixmap_from_bitmap_data(conn, m_screen->root(),
                                                             const_cast<uint8_t*>(open ? openhandm_bits : closedhandm_bits),
                                                             16, 16, 1, 0, 0, nullptr);
        cursor = xcb_generate_id(conn);
        xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
    } else if (cshape == Qt::DragCopyCursor || cshape == Qt::DragMoveCursor
               || cshape == Qt::DragLinkCursor) {
        QImage image = QGuiApplicationPrivate::instance()->getPixmapCursor(static_cast<Qt::CursorShape>(cshape)).toImage();
        if (!image.isNull()) {
            xcb_pixmap_t pm = qt_xcb_XPixmapFromBitmap(m_screen, image);
            xcb_pixmap_t pmm = qt_xcb_XPixmapFromBitmap(m_screen, image.createAlphaMask());
            cursor = xcb_generate_id(conn);
            xcb_create_cursor(conn, cursor, pm, pmm, 0, 0, 0, 0xFFFF, 0xFFFF, 0xFFFF, 8, 8);
            xcb_free_pixmap(conn, pm);
            xcb_free_pixmap(conn, pmm);
        }
    }

    return cursor;
}